

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

bool __thiscall TimerHeap::setTime(TimerHeap *this,timeType_ *now,timeType_ *time)

{
  long lVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  Logger local_fe0;
  
  lVar1 = time->sec;
  lVar2 = time->msec;
  if ((lVar2 == 0 || lVar1 == 0) ||
     ((now->sec <= lVar1 && ((lVar1 != now->sec || (now->msec <= lVar2)))))) {
    (this->howlong_).it_value.tv_sec = lVar1;
    (this->howlong_).it_value.tv_nsec = lVar2 * 1000000;
    iVar3 = timerfd_settime(this->timerfd_,1,(itimerspec *)&this->howlong_,(itimerspec *)0x0);
    bVar4 = iVar3 != -1;
  }
  else {
    Logger::Logger(&local_fe0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                   ,0x92);
    if (0xc < ((int)&local_fe0 + 0xfa8) - (int)local_fe0.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_fe0.impl_.stream_.buffer_.cur_,"Timer error ",0xc);
      local_fe0.impl_.stream_.buffer_.cur_ = local_fe0.impl_.stream_.buffer_.cur_ + 0xc;
    }
    Logger::~Logger(&local_fe0);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool TimerHeap::setTime(const Timer::timeType_& now, const Timer::timeType_& time) {
    if (time.sec != 0 && time.msec != 0 && time < now) {
        LOG <<"Timer error ";
        return false;
    }
    howlong_.it_value.tv_sec = time.sec;
    howlong_.it_value.tv_nsec = time.msec * 1000 * 1000;
    if (timerfd_settime(timerfd_, TFD_TIMER_ABSTIME, &howlong_, NULL) == -1) return false; 
    return true;
}